

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPublicKey.cpp
# Opt level: O3

bool __thiscall RSAPublicKey::deserialise(RSAPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dE;
  ByteString dN;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x30))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x38))(this,&local_68);
      goto LAB_00130c48;
    }
  }
  bVar2 = false;
LAB_00130c48:
  local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_68.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_40.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar2;
}

Assistant:

bool RSAPublicKey::deserialise(ByteString& serialised)
{
	ByteString dN = ByteString::chainDeserialise(serialised);
	ByteString dE = ByteString::chainDeserialise(serialised);

	if ((dN.size() == 0) ||
	    (dE.size() == 0))
	{
		return false;
	}

	setN(dN);
	setE(dE);

	return true;
}